

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-CTA-cs16btech11038.cpp
# Opt level: O1

void __thiscall FOCC_CTA::~FOCC_CTA(FOCC_CTA *this)

{
  pointer ppDVar1;
  DataItem *pDVar2;
  pointer ppDVar3;
  
  garbageCollect(this);
  ppDVar1 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar3 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppDVar3 != ppDVar1; ppDVar3 = ppDVar3 + 1
      ) {
    pDVar2 = *ppDVar3;
    if (pDVar2 != (DataItem *)0x0) {
      std::
      _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
      ::~_Rb_tree(&(pDVar2->read_list)._M_t);
      operator_delete(pDVar2,0x60);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  ::~_Rb_tree(&(this->transactions)._M_t);
  ppDVar3 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar3 != (pointer)0x0) {
    operator_delete(ppDVar3,(long)(this->dataItems).
                                  super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppDVar3)
    ;
    return;
  }
  return;
}

Assistant:

FOCC_CTA::~FOCC_CTA() {
    garbageCollect();
    for(auto e: dataItems){
        delete(e);
    }
}